

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_declaration.c
# Opt level: O0

Type * parse_abstract_declarator
                 (Translation_Data *translation_data,Scope *scope,Denotation_Prototype *prototype)

{
  Type *ret;
  Denoted_Base *base;
  Denotation_Prototype *prototype_local;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  get_denoted_base(prototype);
  parse_declarator_inner(translation_data,scope,(Denoted_Base *)ret);
  if ((ret->specifier == TS_FUNC) || (ret->node != (Map *)0x0)) {
    push_translation_error("unexpedted id in abstract declarator",translation_data);
    delete_denoted_prototype(prototype);
    translation_data_local = *(Translation_Data **)(ret + 1);
    delete_denoted_base((Denoted_Base *)ret);
  }
  else {
    delete_denoted_prototype(prototype);
    translation_data_local = *(Translation_Data **)(ret + 1);
    delete_denoted_base((Denoted_Base *)ret);
  }
  return (Type *)translation_data_local;
}

Assistant:

struct Type* parse_abstract_declarator(struct Translation_Data *translation_data,struct Scope *scope,struct Denotation_Prototype *prototype)
{
	struct Denoted_Base *base;
	struct Type *ret;


	get_denoted_base(prototype);
	parse_declarator_inner(translation_data,scope,base);

	if(base->denotation==DT_Error || base->id!=NULL)
	{
		/*TODO error*/
		push_translation_error("unexpedted id in abstract declarator",translation_data);
		delete_denoted_prototype(prototype);
		ret=base->type;
		delete_denoted_base(base);
		return ret;
	}
	delete_denoted_prototype(prototype);
	ret=base->type;
	delete_denoted_base(base);
	return ret;

}